

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd.cc
# Opt level: O1

ScopedFILE FDToFILE(ScopedFD *fd,char *mode)

{
  FILE *pFVar1;
  char *in_RDX;
  
  *(undefined8 *)fd = 0;
  pFVar1 = fdopen(*(int *)mode,in_RDX);
  *(FILE **)fd = pFVar1;
  if (pFVar1 != (FILE *)0x0) {
    mode[0] = -1;
    mode[1] = -1;
    mode[2] = -1;
    mode[3] = -1;
  }
  return (__uniq_ptr_data<_IO_FILE,_FileCloser,_true,_true>)
         (__uniq_ptr_data<_IO_FILE,_FileCloser,_true,_true>)fd;
}

Assistant:

ScopedFILE FDToFILE(ScopedFD fd, const char *mode) {
  ScopedFILE ret;
#if defined(OPENSSL_WINDOWS)
  ret.reset(_fdopen(fd.get(), mode));
#else
  ret.reset(fdopen(fd.get(), mode));
#endif
  // |fdopen| takes ownership of |fd| on success.
  if (ret) {
    fd.release();
  }
  return ret;
}